

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

lostFraction __thiscall llvm::detail::IEEEFloat::shiftSignificandRight(IEEEFloat *this,uint bits)

{
  short sVar1;
  short sVar2;
  lostFraction lVar3;
  Significand *parts;
  uint uVar4;
  
  sVar1 = (short)*(undefined4 *)&this->exponent;
  sVar2 = sVar1 + (short)bits;
  if (sVar1 <= sVar2) {
    this->exponent = sVar2;
    uVar4 = this->semantics->precision;
    if (uVar4 - 0x40 < 0xffffff80) {
      parts = (Significand *)(this->significand).parts;
    }
    else {
      parts = &this->significand;
    }
    uVar4 = uVar4 + 0x40 >> 6;
    lVar3 = lostFractionThroughTruncation(&parts->part,uVar4,bits);
    APInt::tcShiftRight(&parts->part,uVar4,bits);
    return lVar3;
  }
  __assert_fail("(ExponentType) (exponent + bits) >= exponent",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x48f,"lostFraction llvm::detail::IEEEFloat::shiftSignificandRight(unsigned int)");
}

Assistant:

lostFraction IEEEFloat::shiftSignificandRight(unsigned int bits) {
  /* Our exponent should not overflow.  */
  assert((ExponentType) (exponent + bits) >= exponent);

  exponent += bits;

  return shiftRight(significandParts(), partCount(), bits);
}